

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kriging.cpp
# Opt level: O2

tuple<arma::Col<double>,_arma::Col<double>_> * __thiscall
Kriging::leaveOneOutVec
          (tuple<arma::Col<double>,_arma::Col<double>_> *__return_storage_ptr__,Kriging *this,
          vec *_theta)

{
  subview_col<double> local_1a8;
  subview_col<double> local_178;
  mat yhat;
  _Tuple_impl<0UL,_arma::subview_col<double>,_arma::eOp<arma::subview_col<double>,_arma::eop_scalar_times>_>
  local_98;
  
  arma::Mat<double>::Mat<arma::fill::fill_none>
            (&yhat,(this->m_y).super_Mat<double>.n_elem,2,
             (fill_class<arma::fill::fill_none> *)&arma::fill::none);
  _leaveOneOut(this,_theta,(vec *)0x0,&yhat,(KModel *)0x0,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)0x0);
  arma::arma_check_bounds<char[32]>
            (yhat.n_cols == 0,(char (*) [32])"Mat::col(): index out of bounds");
  local_178.super_subview<double>.aux_row1 = 0;
  local_178.super_subview<double>.aux_col1 = 0;
  local_178.super_subview<double>.n_rows = yhat.n_rows;
  local_178.super_subview<double>.n_cols = 1;
  local_178.super_subview<double>.n_elem = yhat.n_rows;
  local_178.colmem = yhat.mem;
  local_178.super_subview<double>.m = &yhat;
  arma::arma_check_bounds<char[32]>
            (yhat.n_cols < 2,(char (*) [32])"Mat::col(): index out of bounds");
  local_1a8.super_subview<double>.aux_row1 = 0;
  local_1a8.super_subview<double>.aux_col1 = 1;
  local_1a8.super_subview<double>.n_rows = yhat.n_rows;
  local_1a8.super_subview<double>.n_cols = 1;
  local_1a8.super_subview<double>.n_elem = yhat.n_rows;
  local_1a8.colmem = yhat.mem + yhat.n_rows;
  local_98.super__Tuple_impl<1UL,_arma::eOp<arma::subview_col<double>,_arma::eop_scalar_times>_>.
  super__Head_base<1UL,_arma::eOp<arma::subview_col<double>,_arma::eop_scalar_times>,_false>.
  _M_head_impl.aux = this->m_sigma2;
  local_1a8.super_subview<double>.m = &yhat;
  if (local_98.super__Tuple_impl<1UL,_arma::eOp<arma::subview_col<double>,_arma::eop_scalar_times>_>
      .super__Head_base<1UL,_arma::eOp<arma::subview_col<double>,_arma::eop_scalar_times>,_false>.
      _M_head_impl.aux < 0.0) {
    local_98.super__Tuple_impl<1UL,_arma::eOp<arma::subview_col<double>,_arma::eop_scalar_times>_>.
    super__Head_base<1UL,_arma::eOp<arma::subview_col<double>,_arma::eop_scalar_times>,_false>.
    _M_head_impl.aux =
         sqrt(local_98.
              super__Tuple_impl<1UL,_arma::eOp<arma::subview_col<double>,_arma::eop_scalar_times>_>.
              super__Head_base<1UL,_arma::eOp<arma::subview_col<double>,_arma::eop_scalar_times>,_false>
              ._M_head_impl.aux);
  }
  else {
    local_98.super__Tuple_impl<1UL,_arma::eOp<arma::subview_col<double>,_arma::eop_scalar_times>_>.
    super__Head_base<1UL,_arma::eOp<arma::subview_col<double>,_arma::eop_scalar_times>,_false>.
    _M_head_impl.aux =
         SQRT(local_98.
              super__Tuple_impl<1UL,_arma::eOp<arma::subview_col<double>,_arma::eop_scalar_times>_>.
              super__Head_base<1UL,_arma::eOp<arma::subview_col<double>,_arma::eop_scalar_times>,_false>
              ._M_head_impl.aux);
  }
  local_98.super__Tuple_impl<1UL,_arma::eOp<arma::subview_col<double>,_arma::eop_scalar_times>_>.
  super__Head_base<1UL,_arma::eOp<arma::subview_col<double>,_arma::eop_scalar_times>,_false>.
  _M_head_impl.P.Q = &local_1a8;
  arma::subview_col<double>::subview_col
            (&local_98.super__Head_base<0UL,_arma::subview_col<double>,_false>._M_head_impl,
             &local_178);
  std::_Tuple_impl<0ul,arma::Col<double>,arma::Col<double>>::
  _Tuple_impl<arma::subview_col<double>,arma::eOp<arma::subview_col<double>,arma::eop_scalar_times>>
            ((_Tuple_impl<0ul,arma::Col<double>,arma::Col<double>> *)__return_storage_ptr__,
             &local_98);
  arma::Mat<double>::~Mat(&yhat);
  return __return_storage_ptr__;
}

Assistant:

LIBKRIGING_EXPORT std::tuple<arma::vec, arma::vec> Kriging::leaveOneOutVec(const arma::vec& _theta) {
  double loo = -1;
  arma::mat yhat = arma::mat(m_y.n_elem, 2, arma::fill::none);
  loo = _leaveOneOut(_theta, nullptr, &yhat, nullptr, nullptr);

  return std::make_tuple(std::move(yhat.col(0)), std::move(yhat.col(1) * std::sqrt(m_sigma2)));
}